

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
          (GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *this,
          IEnumerableCore<linq::IEnumerable<int>_> *in,function<bool_(const_int_&)> *transformer)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_IState<linq::IGrouping<bool,_int_&>_>)._vptr_IState =
       (_func_int **)&PTR_Init_0013e558;
  IEnumerable<int>::IEnumerable(&(this->source).source,&in->source);
  std::function<bool_(const_int_&)>::function(&this->transformer,transformer);
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->result)._M_t._M_impl.super__Rb_tree_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current)._M_node = (_Base_ptr)0x0;
  return;
}

Assistant:

GroupByState(S&& in, const std::function<KEY(const VALUE&)>& transformer) 
				: source(in), transformer(transformer)
			{
			}